

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O2

void __thiscall
t_c_glib_generator::generate_serialize_container
          (t_c_glib_generator *this,ostream *out,t_type *ttype,string *prefix,int error_ret)

{
  int *piVar1;
  string *__rhs;
  int iVar2;
  t_type *ptVar3;
  t_type *ptVar4;
  ostream *poVar5;
  char *pcVar6;
  t_c_glib_generator *this_00;
  string tkey_ptr;
  string tval_ptr;
  string tval_name;
  string keyname;
  string tkey_name;
  string valname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string *local_298;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_298 = prefix;
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      __rhs = local_298;
      if ((char)iVar2 == '\0') goto LAB_00160f04;
      std::operator+(&local_270,"(",local_298);
      std::operator+(&local_2b8,&local_270," ? ");
      std::operator+(&local_230,&local_2b8,__rhs);
      std::operator+(&local_1f0,&local_230,"->len : 0)");
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::string((string *)&local_f0,"i",(allocator *)&local_2b8);
      t_generator::tmp(&local_230,(t_generator *)this,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_2b8);
      poVar5 = std::operator<<(poVar5,"guint ");
      poVar5 = std::operator<<(poVar5,(string *)&local_230);
      poVar5 = std::operator<<(poVar5,";");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_270,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_270);
      pcVar6 = "if ((ret = thrift_protocol_write_list_begin (protocol, ";
      poVar5 = std::operator<<(poVar5,"if ((ret = thrift_protocol_write_list_begin (protocol, ");
      type_to_enum_abi_cxx11_
                (&local_210,(t_c_glib_generator *)pcVar6,*(t_type **)&ttype[1].super_t_doc.has_doc_)
      ;
      poVar5 = std::operator<<(poVar5,(string *)&local_210);
      poVar5 = std::operator<<(poVar5,", (gint32) ");
      poVar5 = std::operator<<(poVar5,(string *)&local_1f0);
      poVar5 = std::operator<<(poVar5,", error)) < 0)");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_2b8);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_2b8);
      poVar5 = std::operator<<(poVar5,"return ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,error_ret);
      poVar5 = std::operator<<(poVar5,";");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2b8);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_2b8);
      poVar5 = std::operator<<(poVar5,"xfer += ret;");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_270,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_270);
      poVar5 = std::operator<<(poVar5,"for (");
      poVar5 = std::operator<<(poVar5,(string *)&local_230);
      poVar5 = std::operator<<(poVar5," = 0; ");
      poVar5 = std::operator<<(poVar5,(string *)&local_230);
      poVar5 = std::operator<<(poVar5," < ");
      poVar5 = std::operator<<(poVar5,(string *)&local_1f0);
      poVar5 = std::operator<<(poVar5,"; ");
      poVar5 = std::operator<<(poVar5,(string *)&local_230);
      poVar5 = std::operator<<(poVar5,"++)");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_2b8);
      t_oop_generator::scope_up(&this->super_t_oop_generator,out);
      std::__cxx11::string::string((string *)&local_110,(string *)local_298);
      std::__cxx11::string::string((string *)&local_130,(string *)&local_230);
      generate_serialize_list_element(this,out,(t_list *)ttype,&local_110,&local_130,error_ret);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
      t_oop_generator::scope_down(&this->super_t_oop_generator,out);
      t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_2b8);
      poVar5 = std::operator<<(poVar5,
                               "if ((ret = thrift_protocol_write_list_end (protocol, error)) < 0)");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2b8);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_2b8);
      poVar5 = std::operator<<(poVar5,"return ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,error_ret);
      poVar5 = std::operator<<(poVar5,";");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2b8);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_2b8);
      poVar5 = std::operator<<(poVar5,"xfer += ret;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
    else {
      ptVar3 = *(t_type **)&ttype[1].super_t_doc.has_doc_;
      type_name_abi_cxx11_(&local_1f0,this,ptVar3,false,false);
      iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[6])(ptVar3);
      if ((char)iVar2 == '\0') {
        iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[5])(ptVar3);
        pcVar6 = "";
        if ((char)iVar2 != '\0') {
          pcVar6 = "*";
        }
      }
      else {
        pcVar6 = "";
      }
      std::__cxx11::string::string((string *)&local_230,pcVar6,(allocator *)&local_2b8);
      t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_2b8);
      poVar5 = std::operator<<(poVar5,"GList *key_list = NULL, *iter = NULL;");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_270,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_270);
      poVar5 = std::operator<<(poVar5,(string *)&local_1f0);
      poVar5 = std::operator<<(poVar5,(string *)&local_230);
      poVar5 = std::operator<<(poVar5,"* keys;");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_210,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_210);
      poVar5 = std::operator<<(poVar5,"int i = 0, key_count;");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_1d0,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_1d0);
      poVar5 = std::operator<<(poVar5,(string *)&local_1f0);
      poVar5 = std::operator<<(poVar5,(string *)&local_230);
      poVar5 = std::operator<<(poVar5," elem;");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_290,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_290);
      poVar5 = std::operator<<(poVar5,"gpointer value;");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_250);
      poVar5 = std::operator<<(poVar5,"THRIFT_UNUSED_VAR (value);");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_190,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_190);
      pcVar6 = "if ((ret = thrift_protocol_write_set_begin (protocol, ";
      poVar5 = std::operator<<(poVar5,"if ((ret = thrift_protocol_write_set_begin (protocol, ");
      type_to_enum_abi_cxx11_(&local_1b0,(t_c_glib_generator *)pcVar6,ptVar3);
      poVar5 = std::operator<<(poVar5,(string *)&local_1b0);
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = std::operator<<(poVar5,(string *)local_298);
      poVar5 = std::operator<<(poVar5," ? ");
      poVar5 = std::operator<<(poVar5,"(gint32) g_hash_table_size ((GHashTable *) ");
      poVar5 = std::operator<<(poVar5,(string *)local_298);
      poVar5 = std::operator<<(poVar5,") : 0");
      poVar5 = std::operator<<(poVar5,", error)) < 0)");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_2b8);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_2b8);
      poVar5 = std::operator<<(poVar5,"return ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,error_ret);
      poVar5 = std::operator<<(poVar5,";");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2b8);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_2b8);
      poVar5 = std::operator<<(poVar5,"xfer += ret;");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_270,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_270);
      poVar5 = std::operator<<(poVar5,"if (");
      poVar5 = std::operator<<(poVar5,(string *)local_298);
      poVar5 = std::operator<<(poVar5,")");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_210,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_210);
      poVar5 = std::operator<<(poVar5,"  g_hash_table_foreach ((GHashTable *) ");
      poVar5 = std::operator<<(poVar5,(string *)local_298);
      poVar5 = std::operator<<(poVar5,", thrift_hash_table_get_keys, &key_list);");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_1d0,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_1d0);
      poVar5 = std::operator<<(poVar5,"key_count = g_list_length (key_list);");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_290,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_290);
      poVar5 = std::operator<<(poVar5,"keys = g_newa (");
      poVar5 = std::operator<<(poVar5,(string *)&local_1f0);
      poVar5 = std::operator<<(poVar5,(string *)&local_230);
      poVar5 = std::operator<<(poVar5,", key_count);");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_250);
      poVar5 = std::operator<<(poVar5,
                               "for (iter = g_list_first (key_list); iter; iter = iter->next)");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_2b8);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_2b8);
      poVar5 = std::operator<<(poVar5,"keys[i++] = (");
      poVar5 = std::operator<<(poVar5,(string *)&local_1f0);
      poVar5 = std::operator<<(poVar5,(string *)&local_230);
      poVar5 = std::operator<<(poVar5,") iter->data;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2b8);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_2b8);
      poVar5 = std::operator<<(poVar5,"g_list_free (key_list);");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_270,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_270);
      poVar5 = std::operator<<(poVar5,"for (i = 0; i < key_count; ++i)");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_2b8);
      t_oop_generator::scope_up(&this->super_t_oop_generator,out);
      t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_2b8);
      poVar5 = std::operator<<(poVar5,"elem = keys[i];");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_270,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_270);
      poVar5 = std::operator<<(poVar5,"value = (gpointer) g_hash_table_lookup (((GHashTable *) ");
      poVar5 = std::operator<<(poVar5,(string *)local_298);
      poVar5 = std::operator<<(poVar5,"), (gpointer) elem);");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::operator+(&local_d0,&local_230,"elem");
      generate_serialize_set_element(this,out,(t_set *)ttype,&local_d0,error_ret);
      std::__cxx11::string::~string((string *)&local_d0);
      t_oop_generator::scope_down(&this->super_t_oop_generator,out);
      t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_2b8);
      poVar5 = std::operator<<(poVar5,
                               "if ((ret = thrift_protocol_write_set_end (protocol, error)) < 0)");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2b8);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_2b8);
      poVar5 = std::operator<<(poVar5,"return ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,error_ret);
      poVar5 = std::operator<<(poVar5,";");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2b8);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_2b8);
      poVar5 = std::operator<<(poVar5,"xfer += ret;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
  }
  else {
    ptVar3 = *(t_type **)&ttype[1].super_t_doc.has_doc_;
    ptVar4 = *(t_type **)&ttype[1].annotations_._M_t._M_impl;
    type_name_abi_cxx11_(&local_1f0,this,ptVar3,false,false);
    type_name_abi_cxx11_(&local_230,this,ptVar4,false,false);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    local_2b8._M_string_length = 0;
    local_2b8.field_2._M_local_buf[0] = '\0';
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    local_270._M_string_length = 0;
    local_270.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&local_50,"key",(allocator *)&local_1d0);
    t_generator::tmp(&local_210,(t_generator *)this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_70,"val",(allocator *)&local_290);
    t_generator::tmp(&local_1d0,(t_generator *)this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    declore_local_variable_for_write(this,out,ptVar3,&local_210);
    declore_local_variable_for_write(this,out,ptVar4,&local_1d0);
    ptVar3 = t_type::get_true_type(ptVar3);
    ptVar4 = t_type::get_true_type(ptVar4);
    iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[6])(ptVar3);
    if ((char)iVar2 == '\0') {
      (*(ptVar3->super_t_doc)._vptr_t_doc[5])(ptVar3);
    }
    std::__cxx11::string::assign((char *)&local_2b8);
    iVar2 = (*(ptVar4->super_t_doc)._vptr_t_doc[6])(ptVar4);
    if ((char)iVar2 == '\0') {
      (*(ptVar4->super_t_doc)._vptr_t_doc[5])(ptVar4);
    }
    std::__cxx11::string::assign((char *)&local_270);
    t_generator::indent_abi_cxx11_(&local_290,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_290);
    poVar5 = std::operator<<(poVar5,"GList *key_list = NULL, *iter = NULL;");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_250);
    poVar5 = std::operator<<(poVar5,(string *)&local_1f0);
    poVar5 = std::operator<<(poVar5,(string *)&local_2b8);
    poVar5 = std::operator<<(poVar5,"* keys;");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_190,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_190);
    poVar5 = std::operator<<(poVar5,"int i = 0, key_count;");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_1b0);
    pcVar6 = "if ((ret = thrift_protocol_write_map_begin (protocol, ";
    poVar5 = std::operator<<(poVar5,"if ((ret = thrift_protocol_write_map_begin (protocol, ");
    type_to_enum_abi_cxx11_(&local_150,(t_c_glib_generator *)pcVar6,ptVar3);
    poVar5 = std::operator<<(poVar5,(string *)&local_150);
    this_00 = (t_c_glib_generator *)0x2fdaef;
    poVar5 = std::operator<<(poVar5,", ");
    type_to_enum_abi_cxx11_(&local_170,this_00,ptVar4);
    poVar5 = std::operator<<(poVar5,(string *)&local_170);
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = std::operator<<(poVar5,(string *)local_298);
    poVar5 = std::operator<<(poVar5," ? ");
    poVar5 = std::operator<<(poVar5,"(gint32) g_hash_table_size ((GHashTable *) ");
    poVar5 = std::operator<<(poVar5,(string *)local_298);
    poVar5 = std::operator<<(poVar5,") : 0");
    poVar5 = std::operator<<(poVar5,", error)) < 0)");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_290);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_290,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_290);
    poVar5 = std::operator<<(poVar5,"return ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,error_ret);
    poVar5 = std::operator<<(poVar5,";");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_290);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_290,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_290);
    poVar5 = std::operator<<(poVar5,"xfer += ret;");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_250);
    poVar5 = std::operator<<(poVar5,"if (");
    poVar5 = std::operator<<(poVar5,(string *)local_298);
    poVar5 = std::operator<<(poVar5,")");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_190,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_190);
    poVar5 = std::operator<<(poVar5,"  g_hash_table_foreach ((GHashTable *) ");
    poVar5 = std::operator<<(poVar5,(string *)local_298);
    poVar5 = std::operator<<(poVar5,", thrift_hash_table_get_keys, &key_list);");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_1b0);
    poVar5 = std::operator<<(poVar5,"key_count = g_list_length (key_list);");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_150);
    poVar5 = std::operator<<(poVar5,"keys = g_newa (");
    poVar5 = std::operator<<(poVar5,(string *)&local_1f0);
    poVar5 = std::operator<<(poVar5,(string *)&local_2b8);
    poVar5 = std::operator<<(poVar5,", key_count);");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_170);
    poVar5 = std::operator<<(poVar5,"for (iter = g_list_first (key_list); iter; iter = iter->next)")
    ;
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_290);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_290,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_290);
    poVar5 = std::operator<<(poVar5,"keys[i++] = (");
    poVar5 = std::operator<<(poVar5,(string *)&local_1f0);
    poVar5 = std::operator<<(poVar5,(string *)&local_2b8);
    poVar5 = std::operator<<(poVar5,") iter->data;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_290);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_290,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_290);
    poVar5 = std::operator<<(poVar5,"g_list_free (key_list);");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_250);
    poVar5 = std::operator<<(poVar5,"for (i = 0; i < key_count; ++i)");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_290);
    t_oop_generator::scope_up(&this->super_t_oop_generator,out);
    t_generator::indent_abi_cxx11_(&local_290,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_290);
    poVar5 = std::operator<<(poVar5,(string *)&local_210);
    poVar5 = std::operator<<(poVar5," = keys[i];");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_250);
    poVar5 = std::operator<<(poVar5,(string *)&local_1d0);
    poVar5 = std::operator<<(poVar5," = (");
    poVar5 = std::operator<<(poVar5,(string *)&local_230);
    poVar5 = std::operator<<(poVar5,(string *)&local_270);
    poVar5 = std::operator<<(poVar5,") g_hash_table_lookup (((GHashTable *) ");
    poVar5 = std::operator<<(poVar5,(string *)local_298);
    poVar5 = std::operator<<(poVar5,"), (gpointer) ");
    poVar5 = std::operator<<(poVar5,(string *)&local_210);
    poVar5 = std::operator<<(poVar5,");");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_290);
    std::operator+(&local_290,&local_2b8," ");
    std::operator+(&local_90,&local_290,&local_210);
    std::operator+(&local_250,&local_270," ");
    std::operator+(&local_b0,&local_250,&local_1d0);
    generate_serialize_map_element(this,out,(t_map *)ttype,&local_90,&local_b0,error_ret);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_290);
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    t_generator::indent_abi_cxx11_(&local_290,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_290);
    poVar5 = std::operator<<(poVar5,
                             "if ((ret = thrift_protocol_write_map_end (protocol, error)) < 0)");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_290);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_290,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_290);
    poVar5 = std::operator<<(poVar5,"return ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,error_ret);
    poVar5 = std::operator<<(poVar5,";");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_290);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_290,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_290);
    poVar5 = std::operator<<(poVar5,"xfer += ret;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_270);
  }
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1f0);
LAB_00160f04:
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  return;
}

Assistant:

void t_c_glib_generator::generate_serialize_container(ostream& out,
                                                      t_type* ttype,
                                                      string prefix,
                                                      int error_ret) {
  scope_up(out);

  if (ttype->is_map()) {
    t_type* tkey = ((t_map*)ttype)->get_key_type();
    t_type* tval = ((t_map*)ttype)->get_val_type();
    string tkey_name = type_name(tkey);
    string tval_name = type_name(tval);
    string tkey_ptr;
    string tval_ptr;
    string keyname = tmp("key");
    string valname = tmp("val");

    declore_local_variable_for_write(out, tkey, keyname);
    declore_local_variable_for_write(out, tval, valname);

    /* If either the key or value type is a typedef, find its underlying type so
       we can correctly determine how to generate a pointer to it */
    tkey = get_true_type(tkey);
    tval = get_true_type(tval);

    tkey_ptr = tkey->is_string() || !tkey->is_base_type() ? "" : "*";
    tval_ptr = tval->is_string() || !tval->is_base_type() ? "" : "*";

    /*
     * Some ugliness here.  To maximize backwards compatibility, we
     * avoid using GHashTableIter and instead get a GList of all keys,
     * then copy it into a array on the stack, and free it.
     * This is because we may exit early before we get a chance to free the
     * GList.
     */
    out << indent() << "GList *key_list = NULL, *iter = NULL;" << endl
        << indent() << tkey_name << tkey_ptr << "* keys;" << endl
        << indent() << "int i = 0, key_count;" << endl
        << endl
        << indent() << "if ((ret = thrift_protocol_write_map_begin (protocol, "
        << type_to_enum(tkey) << ", " << type_to_enum(tval) << ", " << prefix << " ? "
        << "(gint32) g_hash_table_size ((GHashTable *) " << prefix << ") : 0"
        << ", error)) < 0)" << endl;
    indent_up();
    out << indent() << "return " << error_ret << ";" << endl;
    indent_down();
    out << indent() << "xfer += ret;" << endl
        << indent() << "if (" << prefix << ")" << endl
        << indent() << "  g_hash_table_foreach ((GHashTable *) " << prefix
        << ", thrift_hash_table_get_keys, &key_list);" << endl
        << indent() << "key_count = g_list_length (key_list);" << endl
        << indent() << "keys = g_newa (" << tkey_name << tkey_ptr
        << ", key_count);" << endl
        << indent() << "for (iter = g_list_first (key_list); iter; "
           "iter = iter->next)" << endl;
    indent_up();
    out << indent() << "keys[i++] = (" << tkey_name << tkey_ptr
        << ") iter->data;" << endl;
    indent_down();
    out << indent() << "g_list_free (key_list);" << endl
        << endl
        << indent() << "for (i = 0; i < key_count; ++i)" << endl;
    scope_up(out);
    out << indent() << keyname << " = keys[i];" << endl
        << indent() << valname << " = (" << tval_name << tval_ptr
        << ") g_hash_table_lookup (((GHashTable *) " << prefix
        << "), (gpointer) " << keyname << ");" << endl
        << endl;
    generate_serialize_map_element(out,
                                   (t_map*)ttype,
                                   tkey_ptr + " " + keyname,
                                   tval_ptr + " " + valname,
                                   error_ret);
    scope_down(out);
    out << indent() << "if ((ret = thrift_protocol_write_map_end (protocol, "
           "error)) < 0)" << endl;
    indent_up();
    out << indent() << "return " << error_ret << ";" << endl;
    indent_down();
    out << indent() << "xfer += ret;" << endl;
  } else if (ttype->is_set()) {
    t_type* telem = ((t_set*)ttype)->get_elem_type();
    string telem_name = type_name(telem);
    string telem_ptr = telem->is_string() || !telem->is_base_type() ? "" : "*";
    out << indent() << "GList *key_list = NULL, *iter = NULL;" << endl
        << indent() << telem_name << telem_ptr << "* keys;" << endl
        << indent() << "int i = 0, key_count;" << endl
        << indent() << telem_name << telem_ptr << " elem;" << endl
        << indent() << "gpointer value;" << endl
        << indent() << "THRIFT_UNUSED_VAR (value);" << endl
        << endl
        << indent() << "if ((ret = thrift_protocol_write_set_begin (protocol, "
        << type_to_enum(telem) << ", " << prefix << " ? "
        << "(gint32) g_hash_table_size ((GHashTable *) " << prefix << ") : 0"
        << ", error)) < 0)" << endl;
    indent_up();
    out << indent() << "return " << error_ret << ";" << endl;
    indent_down();
    out << indent() << "xfer += ret;" << endl
        << indent() << "if (" << prefix << ")" << endl
        << indent() << "  g_hash_table_foreach ((GHashTable *) " << prefix
        << ", thrift_hash_table_get_keys, &key_list);" << endl
        << indent() << "key_count = g_list_length (key_list);" << endl
        << indent() << "keys = g_newa (" << telem_name << telem_ptr
        << ", key_count);" << endl
        << indent() << "for (iter = g_list_first (key_list); iter; "
           "iter = iter->next)" << endl;
    indent_up();
    out << indent() << "keys[i++] = (" << telem_name << telem_ptr
        << ") iter->data;" << endl;
    indent_down();
    out << indent() << "g_list_free (key_list);" << endl
        << endl
        << indent() << "for (i = 0; i < key_count; ++i)" << endl;
    scope_up(out);
    out << indent() << "elem = keys[i];" << endl
        << indent() << "value = (gpointer) g_hash_table_lookup "
           "(((GHashTable *) " << prefix << "), (gpointer) elem);" << endl
        << endl;
    generate_serialize_set_element(out,
                                   (t_set*)ttype,
                                   telem_ptr + "elem",
                                   error_ret);
    scope_down(out);
    out << indent() << "if ((ret = thrift_protocol_write_set_end (protocol, "
           "error)) < 0)" << endl;
    indent_up();
    out << indent() << "return " << error_ret << ";" << endl;
    indent_down();
    out << indent() << "xfer += ret;" << endl;
  } else if (ttype->is_list()) {
    string length = "(" + prefix + " ? " + prefix + "->len : 0)";
    string i = tmp("i");
    out << indent() << "guint " << i << ";" << endl
        << endl
        << indent() << "if ((ret = thrift_protocol_write_list_begin (protocol, "
        << type_to_enum(((t_list*)ttype)->get_elem_type()) << ", (gint32) "
        << length << ", error)) < 0)" << endl;
    indent_up();
    out << indent() << "return " << error_ret << ";" << endl;
    indent_down();
    out << indent() << "xfer += ret;" << endl
        << indent() << "for (" << i << " = 0; " << i << " < " << length << "; "
        << i << "++)" << endl;
    scope_up(out);
    generate_serialize_list_element(out, (t_list*)ttype, prefix, i, error_ret);
    scope_down(out);
    out << indent() << "if ((ret = thrift_protocol_write_list_end (protocol, "
           "error)) < 0)" << endl;
    indent_up();
    out << indent() << "return " << error_ret << ";" << endl;
    indent_down();
    out << indent() << "xfer += ret;" << endl;
  }

  scope_down(out);
}